

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O1

char * __thiscall FStringTable::operator[](FStringTable *this,char *name)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  StringEntry *pSVar4;
  
  if (name == (char *)0x0) {
LAB_0048b5e7:
    this = (FStringTable *)0x0;
  }
  else {
    uVar2 = MakeKey(name);
    pSVar4 = this->Buckets[uVar2 & 0x7f];
    do {
      if (pSVar4 == (StringEntry *)0x0) goto LAB_0048b5e7;
      iVar3 = strcasecmp(pSVar4->Name,name);
      if (iVar3 == 1) {
        this = (FStringTable *)0x0;
LAB_0048b5d8:
        bVar1 = false;
      }
      else {
        if (iVar3 == 0) {
          this = (FStringTable *)&pSVar4->field_0x11;
          goto LAB_0048b5d8;
        }
        pSVar4 = pSVar4->Next;
        bVar1 = true;
      }
    } while (bVar1);
  }
  return (char *)this;
}

Assistant:

const char *FStringTable::operator[] (const char *name) const
{
	if (name == NULL)
	{
		return NULL;
	}
	DWORD bucket = MakeKey (name) & (HASH_SIZE - 1);
	StringEntry *entry = Buckets[bucket];

	while (entry != NULL)
	{
		int cmpval = stricmp (entry->Name, name);
		if (cmpval == 0)
		{
			return entry->String;
		}
		if (cmpval == 1)
		{
			return NULL;
		}
		entry = entry->Next;
	}
	return NULL;
}